

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

ArrayPtr<const_kj::(anonymous_namespace)::HttpTestCase> kj::anon_unknown_0::pipelineTestCases(void)

{
  int iVar1;
  ArrayPtr<const_kj::(anonymous_namespace)::HttpTestCase> AVar2;
  StringPtr raw;
  initializer_list<kj::StringPtr> init;
  StringPtr raw_00;
  initializer_list<kj::StringPtr> init_00;
  StringPtr raw_01;
  initializer_list<kj::StringPtr> init_01;
  StringPtr raw_02;
  StringPtr raw_03;
  StringPtr raw_04;
  StringPtr raw_05;
  StringPtr raw_06;
  initializer_list<kj::StringPtr> init_02;
  StringPtr raw_07;
  initializer_list<kj::StringPtr> init_03;
  StringPtr raw_08;
  StringPtr raw_09;
  initializer_list<kj::StringPtr> init_04;
  StringPtr raw_10;
  StringPtr raw_11;
  StringPtr raw_12;
  StringPtr path;
  StringPtr statusText;
  StringPtr path_00;
  StringPtr statusText_00;
  StringPtr path_01;
  StringPtr statusText_01;
  StringPtr path_02;
  StringPtr statusText_02;
  StringPtr path_03;
  StringPtr statusText_03;
  StringPtr path_04;
  StringPtr statusText_04;
  StringPtr path_05;
  StringPtr statusText_05;
  Side SVar3;
  Maybe<unsigned_long> local_428;
  Maybe<unsigned_long> local_418;
  Maybe<unsigned_long> local_408;
  Maybe<unsigned_long> local_3f8;
  Maybe<unsigned_long> local_3e8;
  Maybe<unsigned_long> local_3d8;
  Maybe<unsigned_long> local_3c8;
  Maybe<unsigned_long> local_3b8;
  Maybe<unsigned_long> local_3a8;
  Maybe<unsigned_long> local_398;
  Array<kj::StringPtr> local_388;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_370;
  Array<kj::StringPtr> local_358;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_340;
  Array<kj::StringPtr> local_328;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_310;
  Array<kj::StringPtr> local_2f8;
  Maybe<unsigned_long> local_2e0;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_2d0;
  Array<kj::StringPtr> local_2b8;
  Maybe<unsigned_long> local_2a0;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_290;
  Array<kj::StringPtr> local_278;
  Maybe<unsigned_long> local_260;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_250;
  Array<kj::StringPtr> local_238;
  Maybe<unsigned_long> local_220;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_210;
  Array<kj::StringPtr> local_1f8;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_1e0;
  Array<kj::StringPtr> local_1c8;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_1b0;
  Array<kj::StringPtr> local_198;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_180;
  Array<kj::StringPtr> local_168;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_150;
  Array<kj::StringPtr> local_138;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_120;
  Array<kj::StringPtr> local_108;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_f0;
  Array<kj::(anonymous_namespace)::HeaderTestCase> local_d8;
  StringPtr local_c0;
  StringPtr local_b0;
  StringPtr local_a0;
  StringPtr local_90;
  Array<kj::StringPtr> local_80;
  StringPtr local_68;
  char *local_58;
  undefined8 local_50;
  StringPtr local_48;
  char *local_38;
  undefined8 local_30;
  
  if ((anonymous_namespace)::pipelineTestCases()::PIPELINE_TESTS == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::pipelineTestCases()::PIPELINE_TESTS);
    if (iVar1 != 0) {
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_f0,
                 (initializer_list<kj::(anonymous_namespace)::HeaderTestCase>)ZEXT816(0));
      local_398.ptr.isSet = true;
      local_398.ptr.field_1.value = 0;
      SVar3 = 0x278d55;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_108,
                 (initializer_list<kj::StringPtr>)ZEXT816(0));
      raw.content.size_ = 0x13;
      raw.content.ptr = "GET / HTTP/1.1\r\n\r\n";
      path.content.size_ = 2;
      path.content.ptr = "/";
      HttpRequestTestCase::HttpRequestTestCase
                (&pipelineTestCases::PIPELINE_TESTS[0].request,raw,GET,path,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_f0,
                 &local_398,(InitializeableArray<kj::StringPtr> *)&local_108,SVar3);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_120,
                 (initializer_list<kj::(anonymous_namespace)::HeaderTestCase>)ZEXT816(0));
      local_3a8.ptr.isSet = true;
      local_3a8.ptr.field_1.value = 7;
      local_90.content.ptr = "foo bar";
      local_90.content.size_ = 8;
      init._M_len = 1;
      init._M_array = &local_90;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_138,init);
      raw_00.content.size_ = 0x2e;
      raw_00.content.ptr = "HTTP/1.1 200 OK\r\nContent-Length: 7\r\n\r\nfoo bar";
      statusText.content.size_ = 3;
      statusText.content.ptr = "OK";
      HttpResponseTestCase::HttpResponseTestCase
                (&pipelineTestCases::PIPELINE_TESTS[0].response,raw_00,200,statusText,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_120,
                 &local_3a8,(InitializeableArray<kj::StringPtr> *)&local_138,GET,BOTH);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_150,
                 (initializer_list<kj::(anonymous_namespace)::HeaderTestCase>)ZEXT816(0));
      local_3b8.ptr.isSet = true;
      local_3b8.ptr.field_1.value = 6;
      local_a0.content.ptr = "grault";
      local_a0.content.size_ = 7;
      SVar3 = 0x278e72;
      init_00._M_len = 1;
      init_00._M_array = &local_a0;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_168,init_00);
      raw_01.content.size_ = 0x30;
      raw_01.content.ptr = "POST /foo HTTP/1.1\r\nContent-Length: 6\r\n\r\ngrault";
      path_00.content.size_ = 5;
      path_00.content.ptr = "/foo";
      HttpRequestTestCase::HttpRequestTestCase
                (&pipelineTestCases::PIPELINE_TESTS[1].request,raw_01,POST,path_00,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_150,
                 &local_3b8,(InitializeableArray<kj::StringPtr> *)&local_168,SVar3);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_180,
                 (initializer_list<kj::(anonymous_namespace)::HeaderTestCase>)ZEXT816(0));
      local_3c8.ptr.isSet = true;
      local_3c8.ptr.field_1.value = 0xd;
      local_b0.content.ptr = "baz qux corge";
      local_b0.content.size_ = 0xe;
      init_01._M_len = 1;
      init_01._M_array = &local_b0;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_198,init_01);
      raw_02.content.size_ = 0x3c;
      raw_02.content.ptr = "HTTP/1.1 404 Not Found\r\nContent-Length: 13\r\n\r\nbaz qux corge";
      statusText_00.content.size_ = 10;
      statusText_00.content.ptr = "Not Found";
      HttpResponseTestCase::HttpResponseTestCase
                (&pipelineTestCases::PIPELINE_TESTS[1].response,raw_02,0x194,statusText_00,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_180,
                 &local_3c8,(InitializeableArray<kj::StringPtr> *)&local_198,GET,BOTH);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_1b0,
                 (initializer_list<kj::(anonymous_namespace)::HeaderTestCase>)ZEXT816(0));
      local_3d8.ptr.isSet = true;
      local_3d8.ptr.field_1.value = 0;
      SVar3 = 0x278f68;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_1c8,
                 (initializer_list<kj::StringPtr>)ZEXT816(0));
      raw_03.content.size_ = 0x2a;
      raw_03.content.ptr = "POST /foo HTTP/1.1\r\nContent-Length: 0\r\n\r\n";
      path_01.content.size_ = 5;
      path_01.content.ptr = "/foo";
      HttpRequestTestCase::HttpRequestTestCase
                (&pipelineTestCases::PIPELINE_TESTS[2].request,raw_03,POST,path_01,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_1b0,
                 &local_3d8,(InitializeableArray<kj::StringPtr> *)&local_1c8,SVar3);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_1e0,
                 (initializer_list<kj::(anonymous_namespace)::HeaderTestCase>)ZEXT816(0));
      local_3e8.ptr.isSet = true;
      local_3e8.ptr.field_1.value = 0;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_1f8,
                 (initializer_list<kj::StringPtr>)ZEXT816(0));
      raw_04.content.size_ = 0x27;
      raw_04.content.ptr = "HTTP/1.1 200 OK\r\nContent-Length: 0\r\n\r\n";
      statusText_01.content.size_ = 3;
      statusText_01.content.ptr = "OK";
      HttpResponseTestCase::HttpResponseTestCase
                (&pipelineTestCases::PIPELINE_TESTS[2].response,raw_04,200,statusText_01,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_1e0,
                 &local_3e8,(InitializeableArray<kj::StringPtr> *)&local_1f8,GET,BOTH);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_210,
                 (initializer_list<kj::(anonymous_namespace)::HeaderTestCase>)ZEXT816(0));
      local_220.ptr.isSet = false;
      SVar3 = 0x27903f;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_238,
                 (initializer_list<kj::StringPtr>)ZEXT816(0));
      raw_05.content.size_ = 0x38;
      raw_05.content.ptr = "POST /foo HTTP/1.1\r\nTransfer-Encoding: chunked\r\n\r\n0\r\n\r\n";
      path_02.content.size_ = 5;
      path_02.content.ptr = "/foo";
      HttpRequestTestCase::HttpRequestTestCase
                (&pipelineTestCases::PIPELINE_TESTS[3].request,raw_05,POST,path_02,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_210,
                 &local_220,(InitializeableArray<kj::StringPtr> *)&local_238,SVar3);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_250,
                 (initializer_list<kj::(anonymous_namespace)::HeaderTestCase>)ZEXT816(0));
      local_260.ptr.isSet = false;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_278,
                 (initializer_list<kj::StringPtr>)ZEXT816(0));
      raw_06.content.size_ = 0x35;
      raw_06.content.ptr = "HTTP/1.1 200 OK\r\nTransfer-Encoding: chunked\r\n\r\n0\r\n\r\n";
      statusText_02.content.size_ = 3;
      statusText_02.content.ptr = "OK";
      HttpResponseTestCase::HttpResponseTestCase
                (&pipelineTestCases::PIPELINE_TESTS[3].response,raw_06,200,statusText_02,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_250,
                 &local_260,(InitializeableArray<kj::StringPtr> *)&local_278,GET,BOTH);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_290,
                 (initializer_list<kj::(anonymous_namespace)::HeaderTestCase>)ZEXT816(0));
      local_2a0.ptr.isSet = false;
      local_48.content.ptr = "garply";
      local_48.content.size_ = 7;
      local_38 = "waldo";
      local_30 = 6;
      SVar3 = 0x279145;
      init_02._M_len = 2;
      init_02._M_array = &local_48;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_2b8,init_02);
      raw_07.content.size_ = 0x4d;
      raw_07.content.ptr =
           "POST /bar HTTP/1.1\r\nTransfer-Encoding: chunked\r\n\r\n6\r\ngarply\r\n5\r\nwaldo\r\n0\r\n\r\n"
      ;
      path_03.content.size_ = 5;
      path_03.content.ptr = "/bar";
      HttpRequestTestCase::HttpRequestTestCase
                (&pipelineTestCases::PIPELINE_TESTS[4].request,raw_07,POST,path_03,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_290,
                 &local_2a0,(InitializeableArray<kj::StringPtr> *)&local_2b8,SVar3);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_2d0,
                 (initializer_list<kj::(anonymous_namespace)::HeaderTestCase>)ZEXT816(0));
      local_2e0.ptr.isSet = false;
      local_68.content.ptr = "fred";
      local_68.content.size_ = 5;
      local_58 = "plugh";
      local_50 = 6;
      init_03._M_len = 2;
      init_03._M_array = &local_68;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_2f8,init_03);
      raw_08.content.size_ = 0x48;
      raw_08.content.ptr =
           "HTTP/1.1 200 OK\r\nTransfer-Encoding: chunked\r\n\r\n4\r\nfred\r\n5\r\nplugh\r\n0\r\n\r\n"
      ;
      statusText_03.content.size_ = 3;
      statusText_03.content.ptr = "OK";
      HttpResponseTestCase::HttpResponseTestCase
                (&pipelineTestCases::PIPELINE_TESTS[4].response,raw_08,200,statusText_03,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_2d0,
                 &local_2e0,(InitializeableArray<kj::StringPtr> *)&local_2f8,GET,BOTH);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_310,
                 (initializer_list<kj::(anonymous_namespace)::HeaderTestCase>)ZEXT816(0));
      local_3f8.ptr.isSet = true;
      local_3f8.ptr.field_1.value = 0;
      SVar3 = 0x27924e;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_328,
                 (initializer_list<kj::StringPtr>)ZEXT816(0));
      raw_09.content.size_ = 0x14;
      raw_09.content.ptr = "HEAD / HTTP/1.1\r\n\r\n";
      path_04.content.size_ = 2;
      path_04.content.ptr = "/";
      HttpRequestTestCase::HttpRequestTestCase
                (&pipelineTestCases::PIPELINE_TESTS[5].request,raw_09,HEAD,path_04,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_310,
                 &local_3f8,(InitializeableArray<kj::StringPtr> *)&local_328,SVar3);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_340,
                 (initializer_list<kj::(anonymous_namespace)::HeaderTestCase>)ZEXT816(0));
      local_408.ptr.isSet = true;
      local_408.ptr.field_1.value = 7;
      local_c0.content.ptr = "foo bar";
      local_c0.content.size_ = 8;
      init_04._M_len = 1;
      init_04._M_array = &local_c0;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_358,init_04);
      raw_10.content.size_ = 0x27;
      raw_10.content.ptr = "HTTP/1.1 200 OK\r\nContent-Length: 7\r\n\r\n";
      statusText_04.content.size_ = 3;
      statusText_04.content.ptr = "OK";
      HttpResponseTestCase::HttpResponseTestCase
                (&pipelineTestCases::PIPELINE_TESTS[5].response,raw_10,200,statusText_04,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_340,
                 &local_408,(InitializeableArray<kj::StringPtr> *)&local_358,GET,BOTH);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_370,
                 (initializer_list<kj::(anonymous_namespace)::HeaderTestCase>)ZEXT816(0));
      local_418.ptr.isSet = true;
      local_418.ptr.field_1.value = 0;
      SVar3 = 0x27933d;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_388,
                 (initializer_list<kj::StringPtr>)ZEXT816(0));
      raw_11.content.size_ = 0x14;
      raw_11.content.ptr = "HEAD / HTTP/1.1\r\n\r\n";
      path_05.content.size_ = 2;
      path_05.content.ptr = "/";
      HttpRequestTestCase::HttpRequestTestCase
                (&pipelineTestCases::PIPELINE_TESTS[6].request,raw_11,HEAD,path_05,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_370,
                 &local_418,(InitializeableArray<kj::StringPtr> *)&local_388,SVar3);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                ((InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_d8,
                 (initializer_list<kj::(anonymous_namespace)::HeaderTestCase>)ZEXT816(0));
      local_428.ptr.isSet = true;
      local_428.ptr.field_1.value = 0;
      InitializeableArray<kj::StringPtr>::InitializeableArray
                ((InitializeableArray<kj::StringPtr> *)&local_80,
                 (initializer_list<kj::StringPtr>)ZEXT816(0));
      raw_12.content.size_ = 0x14;
      raw_12.content.ptr = "HTTP/1.1 200 OK\r\n\r\n";
      statusText_05.content.size_ = 3;
      statusText_05.content.ptr = "OK";
      HttpResponseTestCase::HttpResponseTestCase
                (&pipelineTestCases::PIPELINE_TESTS[6].response,raw_12,200,statusText_05,
                 (InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *)&local_d8,
                 &local_428,(InitializeableArray<kj::StringPtr> *)&local_80,HEAD,BOTH);
      Array<kj::StringPtr>::~Array(&local_80);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_d8);
      Array<kj::StringPtr>::~Array(&local_388);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_370);
      Array<kj::StringPtr>::~Array(&local_358);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_340);
      Array<kj::StringPtr>::~Array(&local_328);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_310);
      Array<kj::StringPtr>::~Array(&local_2f8);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_2d0);
      Array<kj::StringPtr>::~Array(&local_2b8);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_290);
      Array<kj::StringPtr>::~Array(&local_278);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_250);
      Array<kj::StringPtr>::~Array(&local_238);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_210);
      Array<kj::StringPtr>::~Array(&local_1f8);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_1e0);
      Array<kj::StringPtr>::~Array(&local_1c8);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_1b0);
      Array<kj::StringPtr>::~Array(&local_198);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_180);
      Array<kj::StringPtr>::~Array(&local_168);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_150);
      Array<kj::StringPtr>::~Array(&local_138);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_120);
      Array<kj::StringPtr>::~Array(&local_108);
      Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&local_f0);
      __cxa_atexit(__cxx_global_array_dtor_548,0,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::pipelineTestCases()::PIPELINE_TESTS);
    }
  }
  AVar2.size_ = 7;
  AVar2.ptr = pipelineTestCases::PIPELINE_TESTS;
  return AVar2;
}

Assistant:

kj::ArrayPtr<const HttpTestCase> pipelineTestCases() {
  static const HttpTestCase PIPELINE_TESTS[] = {
    {
      {
        "GET / HTTP/1.1\r\n"
        "\r\n",

        HttpMethod::GET, "/", {}, uint64_t(0), {},
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "Content-Length: 7\r\n"
        "\r\n"
        "foo bar",

        200, "OK", {}, 7, { "foo bar" }
      },
    },

    {
      {
        "POST /foo HTTP/1.1\r\n"
        "Content-Length: 6\r\n"
        "\r\n"
        "grault",

        HttpMethod::POST, "/foo", {}, 6, { "grault" },
      },
      {
        "HTTP/1.1 404 Not Found\r\n"
        "Content-Length: 13\r\n"
        "\r\n"
        "baz qux corge",

        404, "Not Found", {}, 13, { "baz qux corge" }
      },
    },

    // Throw a zero-size request/response into the pipeline to check for a bug that existed with
    // them previously.
    {
      {
        "POST /foo HTTP/1.1\r\n"
        "Content-Length: 0\r\n"
        "\r\n",

        HttpMethod::POST, "/foo", {}, uint64_t(0), {},
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "Content-Length: 0\r\n"
        "\r\n",

        200, "OK", {}, uint64_t(0), {}
      },
    },

    // Also a zero-size chunked request/response.
    {
      {
        "POST /foo HTTP/1.1\r\n"
        "Transfer-Encoding: chunked\r\n"
        "\r\n"
        "0\r\n"
        "\r\n",

        HttpMethod::POST, "/foo", {}, nullptr, {},
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "Transfer-Encoding: chunked\r\n"
        "\r\n"
        "0\r\n"
        "\r\n",

        200, "OK", {}, nullptr, {}
      },
    },

    {
      {
        "POST /bar HTTP/1.1\r\n"
        "Transfer-Encoding: chunked\r\n"
        "\r\n"
        "6\r\n"
        "garply\r\n"
        "5\r\n"
        "waldo\r\n"
        "0\r\n"
        "\r\n",

        HttpMethod::POST, "/bar", {}, nullptr, { "garply", "waldo" },
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "Transfer-Encoding: chunked\r\n"
        "\r\n"
        "4\r\n"
        "fred\r\n"
        "5\r\n"
        "plugh\r\n"
        "0\r\n"
        "\r\n",

        200, "OK", {}, nullptr, { "fred", "plugh" }
      },
    },

    {
      {
        "HEAD / HTTP/1.1\r\n"
        "\r\n",

        HttpMethod::HEAD, "/", {}, uint64_t(0), {},
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "Content-Length: 7\r\n"
        "\r\n",

        200, "OK", {}, 7, { "foo bar" }
      },
    },

    // Zero-length expected size response to HEAD request has no Content-Length header.
    {
      {
        "HEAD / HTTP/1.1\r\n"
        "\r\n",

        HttpMethod::HEAD, "/", {}, uint64_t(0), {},
      },
      {
        "HTTP/1.1 200 OK\r\n"
        "\r\n",

        200, "OK", {}, uint64_t(0), {}, HttpMethod::HEAD,
      },
    },
  };

  // TODO(cleanup): A bug in GCC 4.8, fixed in 4.9, prevents RESPONSE_TEST_CASES from implicitly
  //   casting to our return type.
  return kj::arrayPtr(PIPELINE_TESTS, kj::size(PIPELINE_TESTS));
}